

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall CTPNAddrBase::is_addr_eq(CTPNAddrBase *this,CTPNAddr *node,int *comparable)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CTcPrsNode *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcPrsNode *pCVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 *in_RDX;
  CTPNUnaryBase *in_RSI;
  CTPNUnaryBase *in_RDI;
  CTcPrsNode *sym2;
  CTcPrsNode *sym1;
  bool local_39;
  
  pCVar4 = CTPNUnaryBase::get_sub_expr(in_RDI);
  iVar1 = (*(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    pCVar4 = CTPNUnaryBase::get_sub_expr(in_RSI);
    iVar1 = (*(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])();
    if (CONCAT44(extraout_var_00,iVar1) != 0) {
      *in_RDX = 1;
      pCVar4 = CTPNUnaryBase::get_sub_expr(in_RDI);
      pCVar5 = CTPNUnaryBase::get_sub_expr(in_RSI);
      iVar1 = (*(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])();
      iVar2 = (*(pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])();
      local_39 = false;
      if (CONCAT44(extraout_var_01,iVar1) == CONCAT44(extraout_var_02,iVar2)) {
        iVar1 = (*(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])();
        iVar2 = (*(pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])();
        iVar3 = (*(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])();
        iVar1 = memcmp((void *)CONCAT44(extraout_var_03,iVar1),
                       (void *)CONCAT44(extraout_var_04,iVar2),CONCAT44(extraout_var_05,iVar3));
        local_39 = iVar1 == 0;
      }
      return (uint)local_39;
    }
  }
  *in_RDX = 0;
  return 0;
}

Assistant:

int CTPNAddrBase::is_addr_eq(const CTPNAddr *node, int *comparable) const
{
    /* 
     *   If both sides are symbols, the addresses are equal if and only if
     *   the symbols are identical.  One symbol has exactly one meaning in
     *   a given context, and no two symbols can have the same meaning.
     *   (It's important that we be able to state this for all symbols,
     *   because we can't necessarily know during parsing the meaning of a
     *   given symbol, since the symbol could be a forward reference.)  
     */
    if (get_sub_expr()->get_sym_text() != 0
        && node->get_sub_expr()->get_sym_text() != 0)
    {
        CTcPrsNode *sym1;
        CTcPrsNode *sym2;

        /* they're both symbols, so they're comparable */
        *comparable = TRUE;

        /* they're the same if both symbols have the same text */
        sym1 = get_sub_expr();
        sym2 = node->get_sub_expr();
        return (sym1->get_sym_text_len() == sym2->get_sym_text_len()
                && memcmp(sym1->get_sym_text(), sym2->get_sym_text(),
                          sym1->get_sym_text_len()) == 0);
    }

    /* they're not comparable */
    *comparable = FALSE;
    return FALSE;
}